

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_ManAssignInternTwo(Bac_Ntk_t *p,int iNum,int nDigits,char *pPref,Vec_Int_t *vMap)

{
  int iVar1;
  int i;
  uint uVar2;
  char Buffer [16];
  
  uVar2 = 0;
  i = 0;
  do {
    if (i != 0) {
      iVar1 = Vec_IntEntry(vMap,i);
      if (iVar1 == 0) {
        Vec_IntWriteEntry(vMap,i,1);
        return i;
      }
    }
    if (uVar2 == 0) {
      sprintf(Buffer,"%s%0*d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum);
    }
    else {
      sprintf(Buffer,"%s%0*d_%d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum,(ulong)uVar2);
    }
    i = Abc_NamStrFindOrAdd(p->pDesign->pStrs,Buffer,(int *)0x0);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int Bac_ManAssignInternTwo( Bac_Ntk_t * p, int iNum, int nDigits, char * pPref, Vec_Int_t * vMap )
{
    char Buffer[16]; int i, NameId = 0;
    for ( i = 0; !NameId || Vec_IntEntry(vMap, NameId); i++ )
    {
        if ( i == 0 )
            sprintf( Buffer, "%s%0*d", pPref, nDigits, iNum );
        else
            sprintf( Buffer, "%s%0*d_%d", pPref, nDigits, iNum, i );
        NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, Buffer, NULL );
    }
    Vec_IntWriteEntry( vMap, NameId, 1 );
    return NameId;
}